

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseNotationDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  int inputid;
  xmlChar *Systemid;
  xmlChar *Pubid;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    name = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    if ((((**(char **)(*(long *)(name + 0x38) + 0x20) == 'N') &&
         (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == 'O')) &&
        (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 2) == 'T')) &&
       (((*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 3) == 'A' &&
         (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 4) == 'T')) &&
        ((*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 5) == 'I' &&
         ((*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 6) == 'O' &&
          (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 7) == 'N')))))))) {
      iVar1 = *(int *)(*(long *)(name + 0x38) + 100);
      *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 8;
      *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 8;
      if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
        xmlParserGrow((xmlParserCtxtPtr)name);
      }
      iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
      if (iVar2 == 0) {
        xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                       "Space required after \'<!NOTATION\'\n");
      }
      else {
        Pubid = xmlParseName((xmlParserCtxtPtr)name);
        if (Pubid == (xmlChar *)0x0) {
          xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
        }
        else {
          pxVar3 = xmlStrchr(Pubid,':');
          if (pxVar3 != (xmlChar *)0x0) {
            xmlNsErr((xmlParserCtxtPtr)name,XML_NS_ERR_COLON,
                     "colons are forbidden from notation names \'%s\'\n",Pubid,(xmlChar *)0x0,
                     (xmlChar *)0x0);
          }
          iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
          if (iVar2 == 0) {
            xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                           "Space required after the NOTATION name\'\n");
          }
          else {
            pxVar3 = xmlParseExternalID((xmlParserCtxtPtr)name,&Systemid,0);
            xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
            if (**(char **)(*(long *)(name + 0x38) + 0x20) == '>') {
              if (iVar1 != *(int *)(*(long *)(name + 0x38) + 100)) {
                xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_ENTITY_BOUNDARY,
                               "Notation declaration doesn\'t start and stop in the same entity\n");
              }
              xmlNextChar((xmlParserCtxtPtr)name);
              if (((*(long *)name != 0) && (*(int *)(name + 0x14c) == 0)) &&
                 (*(long *)(*(long *)name + 0x38) != 0)) {
                (**(code **)(*(long *)name + 0x38))(*(undefined8 *)(name + 8),Pubid,Systemid,pxVar3)
                ;
              }
            }
            else {
              xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
            }
            if (pxVar3 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar3);
            }
            if (Systemid != (xmlChar *)0x0) {
              (*xmlFree)(Systemid);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParseNotationDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *Pubid;
    xmlChar *Systemid;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    if (CMP8(CUR_PTR, 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	int inputid = ctxt->input->id;
	SKIP(8);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!NOTATION'\n");
	    return;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	    return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from notation names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		     "Space required after the NOTATION name'\n");
	    return;
	}

	/*
	 * Parse the IDs.
	 */
	Systemid = xmlParseExternalID(ctxt, &Pubid, 0);
	SKIP_BLANKS_PE;

	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Notation declaration doesn't start and stop"
                               " in the same entity\n");
	    }
	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->notationDecl != NULL))
		ctxt->sax->notationDecl(ctxt->userData, name, Pubid, Systemid);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
	}
	if (Systemid != NULL) xmlFree(Systemid);
	if (Pubid != NULL) xmlFree(Pubid);
    }
}